

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generation_iterator.cpp
# Opt level: O1

void __thiscall
GenerationIterator_InitialStoreIterationHasDistance1_Test::TestBody
          (GenerationIterator_InitialStoreIterationHasDistance1_Test *this)

{
  database *pdVar1;
  typed_address<pstore::trailer> tVar2;
  char *pcVar3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  generation_iterator begin;
  generation_iterator end;
  typed_address<pstore::trailer> local_78;
  undefined1 local_70 [8];
  typed_address<pstore::trailer> local_68;
  typed_address<pstore::trailer> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  not_null<const_pstore::database_*> local_50;
  not_null<const_pstore::database_*> local_48;
  generation_iterator local_40;
  generation_iterator local_30;
  
  pdVar1 = &(this->super_GenerationIterator).db_;
  local_48.ptr_ = pdVar1;
  pstore::gsl::not_null<const_pstore::database_*>::ensure_invariant(&local_48);
  local_40.pos_.a_.a_ = (address)(this->super_GenerationIterator).db_.size_.footer_pos_.a_.a_;
  local_40.db_ = local_48.ptr_;
  pstore::generation_iterator::validate(&local_40);
  local_50.ptr_ = pdVar1;
  pstore::gsl::not_null<const_pstore::database_*>::ensure_invariant(&local_50);
  local_30.db_ = local_50.ptr_;
  local_30.pos_.a_.a_ = (address)0;
  pstore::generation_iterator::validate(&local_30);
  tVar2.a_.a_ = local_30.pos_.a_.a_;
  pdVar1 = local_30.db_;
  local_78.a_.a_._0_4_ = 1;
  local_70 = (undefined1  [8])local_40.db_;
  local_68.a_.a_ = local_40.pos_.a_.a_;
  _Var4._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_40.pos_.a_.a_ != local_30.pos_.a_.a_ || local_40.db_ != local_30.db_) {
    do {
      do {
        pstore::generation_iterator::operator++((generation_iterator *)local_70);
        _Var4._M_head_impl = _Var4._M_head_impl + 1;
      } while (local_70 != (undefined1  [8])pdVar1);
    } while (local_68.a_.a_ != tVar2.a_.a_);
  }
  local_70 = (undefined1  [8])_Var4._M_head_impl;
  testing::internal::CmpHelperEQ<unsigned_int,long>
            ((internal *)&local_60,"1U","std::distance (begin, end)",(uint *)&local_78,
             (long *)local_70);
  if (local_60.a_.a_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_70);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_generation_iterator.cpp"
               ,0x56,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (local_70 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_70 + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_60.a_.a_ = (address)0x40;
  local_78.a_.a_ = local_40.pos_.a_.a_;
  testing::internal::
  CmpHelperEQ<pstore::typed_address<pstore::trailer>,pstore::typed_address<pstore::trailer>>
            ((internal *)local_70,"trailer_address::make (pstore::leader_size)","*begin",&local_60,
             &local_78);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68.a_.a_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_68.a_.a_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_generation_iterator.cpp"
               ,0x57,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (local_60.a_.a_ != 0) {
      (**(code **)(*(long *)local_60.a_.a_ + 8))();
    }
  }
  if (local_68.a_.a_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68.a_.a_
                );
  }
  return;
}

Assistant:

TEST_F (GenerationIterator, InitialStoreIterationHasDistance1) {
    auto & d = this->db ();
    auto const begin = generation_iterator{&d, d.footer_pos ()};
    auto const end = generation_iterator{&d, trailer_address::null ()};
    EXPECT_EQ (1U, std::distance (begin, end));
    EXPECT_EQ (trailer_address::make (pstore::leader_size), *begin);
}